

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall
c4::yml::Parser::_location_from_cont(Parser *this,Tree *tree,size_t node,Location *loc)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  NodeData *pNVar4;
  csubstr *pcVar5;
  void *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  csubstr k;
  size_t child;
  char *node_start;
  char msg [40];
  char *in_stack_00000460;
  Parser *in_stack_00000468;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  char *in_stack_fffffffffffffea8;
  Location *in_stack_fffffffffffffeb0;
  undefined1 local_130 [8];
  size_t in_stack_fffffffffffffed8;
  Tree *in_stack_fffffffffffffee0;
  Tree *in_stack_fffffffffffffee8;
  undefined1 local_108 [40];
  char *local_e0;
  size_t local_d8;
  size_t local_d0;
  char *local_c8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined1 local_98 [40];
  void *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_48;
  undefined8 local_40;
  size_t local_38;
  undefined8 local_30;
  NodeData *local_28;
  NodeData *local_10;
  NodeData *local_8;
  
  local_70 = in_RCX;
  local_68 = in_RDX;
  local_60 = in_RSI;
  local_8 = Tree::_p(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  if (((local_8->m_type).type & (STREAM|MAP)) == NOTYPE) {
    memcpy(local_98,"check failed: (tree.is_container(node))",0x28);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    (*pcVar1)(local_98,0x28,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffe88 = local_c0;
    in_stack_fffffffffffffe8c = uStack_bc;
    in_stack_fffffffffffffe90 = uStack_b8;
    in_stack_fffffffffffffe94 = uStack_b4;
  }
  local_40 = local_60;
  local_48 = local_68;
  local_10 = Tree::_p(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  if (((local_10->m_type).type & STREAM) == STREAM) {
    val_location(in_stack_00000468,in_stack_00000460);
    memcpy(local_70,local_130,0x28);
  }
  else {
    pNVar4 = Tree::_p(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_c8 = (pNVar4->m_val).scalar.str;
    bVar2 = Tree::has_children((Tree *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                               ,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (bVar2) {
      local_d0 = Tree::first_child((Tree *)CONCAT44(in_stack_fffffffffffffe94,
                                                    in_stack_fffffffffffffe90),
                                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      local_30 = local_60;
      local_38 = local_d0;
      local_28 = Tree::_p(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      if (((local_28->m_type).type & KEY) != NOTYPE) {
        pcVar5 = Tree::key(in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0);
        local_e0 = pcVar5->str;
        local_d8 = pcVar5->len;
        if ((local_e0 != (char *)0x0) && (local_e0 < local_c8)) {
          local_c8 = local_e0;
        }
      }
    }
    val_location(in_stack_00000468,in_stack_00000460);
    memcpy(local_70,local_108,0x28);
  }
  return true;
}

Assistant:

bool Parser::_location_from_cont(Tree const& tree, size_t node, Location *C4_RESTRICT loc) const
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, tree.is_container(node));
    if(!tree.is_stream(node))
    {
        const char *node_start = tree._p(node)->m_val.scalar.str;  // this was stored in the container
        if(tree.has_children(node))
        {
            size_t child = tree.first_child(node);
            if(tree.has_key(child))
            {
                // when a map starts, the container was set after the key
                csubstr k = tree.key(child);
                if(k.str && node_start > k.str)
                    node_start = k.str;
            }
        }
        *loc = val_location(node_start);
        return true;
    }
    else // it's a stream
    {
        *loc = val_location(m_buf.str); // just return the front of the buffer
    }
    return true;
}